

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O3

string * __thiscall
cmLocalNinjaGenerator::MakeCustomLauncher_abi_cxx11_
          (string *__return_storage_ptr__,cmLocalNinjaGenerator *this,cmCustomCommandGenerator *ccg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  pointer pcVar2;
  int iVar3;
  cmValue cVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  undefined4 extraout_var;
  string_view source;
  string output;
  RuleVariables vars;
  string local_1c0;
  string local_1a0;
  undefined1 local_180 [120];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  cmRulePlaceholderExpander *this_01;
  
  this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  local_180._0_8_ = local_180 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"RULE_LAUNCH_CUSTOM","");
  cVar4 = cmMakefile::GetProperty(this_00,(string *)local_180);
  if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
    operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
  }
  if ((cVar4.Value == (string *)0x0) || ((cVar4.Value)->_M_string_length == 0)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    memset(local_180,0,0x150);
    local_1c0._M_string_length = 0;
    local_1c0.field_2._M_local_buf[0] = '\0';
    local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
    pvVar5 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(ccg);
    if ((pvVar5->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (pvVar5->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::_M_assign((string *)&local_1c0);
      cmCustomCommandGenerator::GetWorkingDirectory_abi_cxx11_(&local_1a0,ccg);
      paVar1 = &local_1a0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
      if (local_1a0._M_string_length == 0) {
        cmOutputConverter::MaybeRelativeToCurBinDir
                  (&local_1a0,
                   &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,&local_1c0);
        std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_1a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != paVar1) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
      }
      source._M_str = local_1c0._M_dataplus._M_p;
      source._M_len = local_1c0._M_string_length;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&local_1a0,
                 &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,source,SHELL);
      std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_1a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
    }
    local_108 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0._M_dataplus._M_p;
    iVar3 = (*(this->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[5])
                      (this);
    this_01 = (cmRulePlaceholderExpander *)CONCAT44(extraout_var,iVar3);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = ((cVar4.Value)->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (cVar4.Value)->_M_string_length);
    cmRulePlaceholderExpander::ExpandRuleVariables
              (this_01,&(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                        super_cmOutputConverter,__return_storage_ptr__,(RuleVariables *)local_180);
    if (__return_storage_ptr__->_M_string_length != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    (*(this_01->super_cmPlaceholderExpander)._vptr_cmPlaceholderExpander[1])(this_01);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,
                      CONCAT71(local_1c0.field_2._M_allocated_capacity._1_7_,
                               local_1c0.field_2._M_local_buf[0]) + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalNinjaGenerator::MakeCustomLauncher(
  cmCustomCommandGenerator const& ccg)
{
  cmValue property_value = this->Makefile->GetProperty("RULE_LAUNCH_CUSTOM");

  if (!cmNonempty(property_value)) {
    return std::string();
  }

  // Expand rule variables referenced in the given launcher command.
  cmRulePlaceholderExpander::RuleVariables vars;

  std::string output;
  const std::vector<std::string>& outputs = ccg.GetOutputs();
  if (!outputs.empty()) {
    output = outputs[0];
    if (ccg.GetWorkingDirectory().empty()) {
      output = this->MaybeRelativeToCurBinDir(output);
    }
    output = this->ConvertToOutputFormat(output, cmOutputConverter::SHELL);
  }
  vars.Output = output.c_str();

  std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
    this->CreateRulePlaceholderExpander());

  std::string launcher = *property_value;
  rulePlaceholderExpander->ExpandRuleVariables(this, launcher, vars);
  if (!launcher.empty()) {
    launcher += " ";
  }

  return launcher;
}